

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int process_file(char *filename,int verbose,int allmeta,int strict)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  exr_context_initializer_t cinit;
  exr_context_t e;
  exr_result_t rv;
  int failcount;
  bool local_91;
  undefined8 local_90;
  code *local_88;
  undefined4 local_38;
  undefined4 local_34;
  uint local_30;
  undefined8 local_28;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  undefined8 local_8;
  
  local_18 = 0;
  local_28 = 0;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(&local_90,0,0x68);
  local_90 = 0x68;
  local_38 = 0xfffffffe;
  local_34 = 0xbf800000;
  local_88 = error_handler_cb;
  if (local_c == 0) {
    local_30 = local_30 | 2;
  }
  if (local_14 != 0) {
    local_30 = local_30 | 1;
  }
  local_1c = exr_start_read(&local_28,local_8,&local_90);
  if (local_1c == 0) {
    local_91 = local_c != 0 || local_10 != 0;
    exr_print_context_info(local_28,local_91);
    exr_finish(&local_28);
  }
  else {
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

static int
process_file (const char* filename, int verbose, int allmeta, int strict)
{
    int                       failcount = 0;
    exr_result_t              rv;
    exr_context_t             e     = NULL;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &error_handler_cb;

    if (!verbose) cinit.flags |= EXR_CONTEXT_FLAG_SILENT_HEADER_PARSE;

    if (strict) cinit.flags |= EXR_CONTEXT_FLAG_STRICT_HEADER;

    rv = exr_start_read (&e, filename, &cinit);

    if (rv == EXR_ERR_SUCCESS)
    {
        exr_print_context_info (e, verbose || allmeta);
        exr_finish (&e);
    }
    else
        ++failcount;
    return failcount;
}